

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O1

void __thiscall QMdiAreaPrivate::activateCurrentWindow(QMdiAreaPrivate *this)

{
  QMdiSubWindowPrivate *this_00;
  QMdiSubWindow *pQVar1;
  
  pQVar1 = QMdiArea::currentSubWindow
                     (*(QMdiArea **)
                       &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                        super_QWidgetPrivate.field_0x8);
  if ((pQVar1 != (QMdiSubWindow *)0x0) &&
     (*(char *)(*(long *)&(pQVar1->super_QWidget).field_0x8 + 0x2dc) == '\0')) {
    this_00 = *(QMdiSubWindowPrivate **)&(pQVar1->super_QWidget).field_0x8;
    this_00->activationEnabled = true;
    QMdiSubWindowPrivate::setActive(this_00,true,false);
    return;
  }
  return;
}

Assistant:

void QMdiAreaPrivate::activateCurrentWindow()
{
    QMdiSubWindow *current = q_func()->currentSubWindow();
    if (current && !isExplicitlyDeactivated(current)) {
        current->d_func()->activationEnabled = true;
        current->d_func()->setActive(true, /*changeFocus=*/false);
    }
}